

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.h
# Opt level: O3

bool __thiscall glslang::TSpirvType::operator==(TSpirvType *this,TSpirvType *rhs)

{
  TSpirvTypeParameter *pTVar1;
  bool bVar2;
  int iVar3;
  TSpirvTypeParameter *this_00;
  pointer rhs_00;
  
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)this
                  ,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)rhs
                 );
  bVar2 = false;
  if ((iVar3 == 0) && ((this->spirvInst).id == (rhs->spirvInst).id)) {
    this_00 = (this->typeParams).
              super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
              .
              super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pTVar1 = (this->typeParams).
             super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
             .
             super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    rhs_00 = (rhs->typeParams).
             super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
             .
             super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pTVar1 - (long)this_00 ==
        (long)(rhs->typeParams).
              super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
              .
              super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)rhs_00) {
      if (this_00 == pTVar1) {
        bVar2 = true;
      }
      else {
        do {
          bVar2 = TSpirvTypeParameter::operator==(this_00,rhs_00);
          if (!bVar2) {
            return bVar2;
          }
          this_00 = this_00 + 1;
          rhs_00 = rhs_00 + 1;
        } while (this_00 != pTVar1);
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool operator==(const TSpirvType& rhs) const
    {
        return spirvInst == rhs.spirvInst && typeParams == rhs.typeParams;
    }